

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void Network_Controller(int playernum,bool add)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  iVar1 = consoleplayer;
  if (consoleplayer != Net_Arbitrator) {
    pcVar6 = "This command is only accessible to the net arbitrator.\n";
LAB_004c18d5:
    Printf(pcVar6);
    return;
  }
  lVar4 = (long)playernum;
  if (((&DAT_00a60421)[lVar4 * 0x2a0] & add) == 1) {
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[lVar4 * 0xa8] - 1 & 0x1cf) * 0x18) +
             (&DAT_00a602c8)[lVar4 * 0x54]);
    do {
      puVar3 = puVar2;
      puVar2 = (undefined8 *)*puVar3;
    } while (*(int *)(puVar3 + 1) != 0x1cf);
    uVar5 = *(undefined8 *)(puVar3[2] + 0x28);
    pcVar6 = "%s is already on the setting controller list.\n";
  }
  else {
    if ((&DAT_00a60421)[lVar4 * 0x2a0] != 0 || add) {
      if (playeringame[lVar4] == false) {
        Printf("Player (%d) not found!\n",playernum);
        return;
      }
      if ((&DAT_00a60428)[lVar4 * 0x54] != 0) {
        if ((*(byte *)((&DAT_00a60428)[lVar4 * 0x54] + 0x20) & 0x20) == 0) {
          pcVar6 = "Bots cannot be added to the controller list.\n";
          goto LAB_004c18d5;
        }
        (&DAT_00a60428)[lVar4 * 0x54] = 0;
      }
      if (iVar1 != playernum) {
        TicSpecial::operator<<(&specials,add ^ 0x31);
        TicSpecial::operator<<(&specials,(BYTE)playernum);
        return;
      }
      pcVar6 = "The net arbitrator cannot have their status changed on this list.\n";
      goto LAB_004c18d5;
    }
    puVar2 = (undefined8 *)
             ((ulong)(((&DAT_00a602d8)[lVar4 * 0xa8] - 1 & 0x1cf) * 0x18) +
             (&DAT_00a602c8)[lVar4 * 0x54]);
    do {
      puVar3 = puVar2;
      puVar2 = (undefined8 *)*puVar3;
    } while (*(int *)(puVar3 + 1) != 0x1cf);
    uVar5 = *(undefined8 *)(puVar3[2] + 0x28);
    pcVar6 = "%s is not on the setting controller list.\n";
  }
  Printf(pcVar6,uVar5);
  return;
}

Assistant:

static void Network_Controller (int playernum, bool add)
{
	if (consoleplayer != Net_Arbitrator)
	{
		Printf ("This command is only accessible to the net arbitrator.\n");
		return;
	}

	if (players[playernum].settings_controller && add)
	{
		Printf ("%s is already on the setting controller list.\n", players[playernum].userinfo.GetName());
		return;
	}

	if (!players[playernum].settings_controller && !add)
	{
		Printf ("%s is not on the setting controller list.\n", players[playernum].userinfo.GetName());
		return;
	}

	if (!playeringame[playernum])
	{
		Printf ("Player (%d) not found!\n", playernum);
		return;
	}

	if (players[playernum].Bot != NULL)
	{
		Printf ("Bots cannot be added to the controller list.\n");
		return;
	}

	if (playernum == Net_Arbitrator)
	{
		Printf ("The net arbitrator cannot have their status changed on this list.\n");
		return;
	}

	if (add)
		Net_WriteByte (DEM_ADDCONTROLLER);
	else
		Net_WriteByte (DEM_DELCONTROLLER);

	Net_WriteByte (playernum);
}